

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_handshake(ptls_iovec_t ticket,int mode,int expect_ticket,int check_ch,
                   int require_client_authentication)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ptls_t *tls;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  char *resp;
  char *req;
  int ret;
  size_t max_early_data_size;
  size_t consumed;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  ptls_handshake_properties_t server_hs_prop;
  ptls_handshake_properties_t client_hs_prop;
  ptls_t *server;
  ptls_t *client;
  int require_client_authentication_local;
  int check_ch_local;
  int expect_ticket_local;
  int mode_local;
  ptls_iovec_t ticket_local;
  
  memset(&server_hs_prop.collected_extensions,0,0x80);
  memset(cbuf_small + 0x3ff8,0,0x80);
  if (check_ch != 0) {
    ctx->verify_certificate = verify_certificate;
  }
  tls = ptls_new(ctx,0);
  client_hs_prop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
       ptls_new(ctx_peer,1);
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,sbuf_small + 0x3ff8,0x4000);
  ptls_buffer_init((ptls_buffer_t *)&decbuf.is_allocated,decbuf_small + 0x3ff8,0x4000);
  ptls_buffer_init((ptls_buffer_t *)&consumed,&cbuf.is_allocated,0x4000);
  if (check_ch != 0) {
    ctx_peer->on_client_hello = &test_handshake::cb;
    server_hs_prop.collected_extensions =
         (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
         test_handshake::protocols;
    ptls_set_server_name(tls,"test.example.com",0);
  }
  ctx_peer->on_extension = &test_handshake::cb_1;
  if (require_client_authentication != 0) {
    ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xf7 | 8;
  }
  if (ctx_peer->esni != (ptls_esni_context_t **)0x0) {
    was_esni = 0;
    ptls_iovec_init(anon_var_dwarf_6d63,0x67);
  }
  if (mode != 2) {
    if (mode == 3) {
      server_hs_prop.field_0.server.selected_psk_binder.len = (size_t)anon_var_dwarf_7a02;
      server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ =
           server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ & 0xfd | 2;
    }
    else if ((mode == 4) && (ctx_peer->max_early_data_size == 0)) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0x24f,"void test_handshake(ptls_iovec_t, int, int, int, int)");
    }
  }
  msg("client handshake enter 1");
  iVar2 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)&server_hs_prop.collected_extensions);
  msg("client handshake exit 1");
  _ok((uint)(iVar2 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",599);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",600);
  if (mode - 1U < 3) {
    max_early_data_size = cbuf.capacity;
    msg("server handshake special enter 1");
    iVar2 = ptls_handshake((ptls_t *)client_hs_prop.collected_extensions,
                           (ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &max_early_data_size,(ptls_handshake_properties_t *)(cbuf_small + 0x3ff8)
                          );
    msg("server handshake special exit 1");
    if (mode == 3) {
      _ok((uint)(iVar2 == 0x206),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x263);
      ptls_free((ptls_t *)client_hs_prop.collected_extensions);
      client_hs_prop.collected_extensions =
           (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
           ptls_new(ctx_peer,1);
    }
    else {
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x267);
    }
    _ok((uint)(cbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x269);
    _ok((uint)(sbuf.capacity != 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x26a);
    cbuf.capacity = 0;
    max_early_data_size = sbuf.capacity;
    msg("client handshake special enter 1");
    iVar2 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                           &max_early_data_size,
                           (ptls_handshake_properties_t *)&server_hs_prop.collected_extensions);
    msg("client handshake special exit 1");
    _ok((uint)(iVar2 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x270);
    _ok((uint)(sbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x271);
    _ok((uint)(cbuf.capacity != 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x272);
    sbuf.capacity = 0;
  }
  else if (mode == 4) {
    _ok((uint)(ctx_peer->max_early_data_size == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x276);
    sVar6 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar2 = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"GET / HTTP/1.0\r\n\r\n",sVar6);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x278);
  }
  max_early_data_size = cbuf.capacity;
  if ((mode == 4) && (require_client_authentication == 1)) {
    _ok(1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
        0x27e);
  }
  do {
    msg("server handshake enter 1, consumed: %d",max_early_data_size);
    uVar3 = ptls_handshake((ptls_t *)client_hs_prop.collected_extensions,
                           (ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &max_early_data_size,(ptls_handshake_properties_t *)(cbuf_small + 0x3ff8)
                          );
    sVar1 = max_early_data_size;
    uVar4 = ptls_handshake_in_private_key((ptls_t *)client_hs_prop.collected_extensions);
    msg("server handshake exit 1, consumed: %d, ret: %d, in_pk: %d",sVar1,(ulong)uVar3,(ulong)uVar4)
    ;
    bVar7 = false;
    if (uVar3 == 0x202) {
      iVar2 = ptls_handshake_in_private_key((ptls_t *)client_hs_prop.collected_extensions);
      bVar7 = iVar2 != 0;
    }
  } while (bVar7);
  if (require_client_authentication == 1) {
    iVar2 = ptls_is_psk_handshake((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x286);
    _ok((uint)(uVar3 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x287);
  }
  else {
    _ok((uint)(uVar3 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x289);
  }
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28c);
  if (check_ch == 0) {
    pcVar5 = ptls_get_server_name((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x294);
    pcVar5 = ptls_get_negotiated_protocol((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x295);
  }
  else {
    pcVar5 = ptls_get_server_name((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28e);
    pcVar5 = ptls_get_server_name((ptls_t *)client_hs_prop.collected_extensions);
    iVar2 = strcmp(pcVar5,"test.example.com");
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28f);
    pcVar5 = ptls_get_negotiated_protocol((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x290);
    pcVar5 = ptls_get_negotiated_protocol((ptls_t *)client_hs_prop.collected_extensions);
    iVar2 = strcmp(pcVar5,"h2");
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x291);
    _ok((uint)(was_esni == (uint)(ctx_peer->esni != (ptls_esni_context_t **)0x0)),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x292);
  }
  if ((mode == 4) && (require_client_authentication == 0)) {
    _ok((uint)(max_early_data_size < cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x299);
    memmove((void *)sbuf._24_8_,(void *)(sbuf._24_8_ + max_early_data_size),
            cbuf.capacity - max_early_data_size);
    max_early_data_size = cbuf.capacity - max_early_data_size;
    cbuf.capacity = max_early_data_size;
    iVar2 = ptls_receive((ptls_t *)client_hs_prop.collected_extensions,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x29f);
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a0);
    sVar1 = decbuf.capacity;
    sVar6 = strlen("GET / HTTP/1.0\r\n\r\n");
    _ok((uint)(sVar1 == sVar6),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a1);
    iVar2 = memcmp((void *)consumed,"GET / HTTP/1.0\r\n\r\n",decbuf.capacity);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a2);
    iVar2 = ptls_handshake_is_complete((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)((iVar2 != 0 ^ 0xffU) & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a3);
    cbuf.capacity = 0;
    decbuf.capacity = 0;
    sVar6 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
    iVar2 = ptls_send((ptls_t *)client_hs_prop.collected_extensions,
                      (ptls_buffer_t *)&decbuf.is_allocated,"HTTP/1.0 200 OK\r\n\r\nhello world\n",
                      sVar6);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a8);
  }
  else {
    if ((mode == 4) && (require_client_authentication == 1)) {
      _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ab);
    }
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ac);
    cbuf.capacity = 0;
  }
  max_early_data_size = sbuf.capacity;
  msg("client handshake enter 2");
  uVar3 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                         &max_early_data_size,(ptls_handshake_properties_t *)0x0);
  msg("client handshake exit 2, ret = %d",(ulong)uVar3);
  _ok((uint)(uVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b4);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b5);
  if (check_ch == 0) {
    pcVar5 = ptls_get_server_name((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",700);
    pcVar5 = ptls_get_negotiated_protocol((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)(pcVar5 == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2bd);
  }
  else {
    pcVar5 = ptls_get_server_name(tls);
    _ok((uint)(pcVar5 != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b7);
    pcVar5 = ptls_get_server_name(tls);
    iVar2 = strcmp(pcVar5,"test.example.com");
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b8);
    pcVar5 = ptls_get_negotiated_protocol(tls);
    _ok((uint)(pcVar5 != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b9);
    pcVar5 = ptls_get_negotiated_protocol(tls);
    iVar2 = strcmp(pcVar5,"h2");
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ba);
  }
  if (expect_ticket == 0) {
    _ok((uint)(max_early_data_size == sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2c5);
    sbuf.capacity = 0;
  }
  else {
    _ok((uint)(max_early_data_size < sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2c1);
    memmove((void *)decbuf._24_8_,(void *)(decbuf._24_8_ + max_early_data_size),
            sbuf.capacity - max_early_data_size);
    sbuf.capacity = sbuf.capacity - max_early_data_size;
  }
  if (require_client_authentication == 1) {
    iVar2 = ptls_handshake_is_complete((ptls_t *)client_hs_prop.collected_extensions);
    _ok((uint)((iVar2 != 0 ^ 0xffU) & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ca);
    max_early_data_size = cbuf.capacity;
    msg("server handshake special enter 2");
    iVar2 = ptls_handshake((ptls_t *)client_hs_prop.collected_extensions,
                           (ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &max_early_data_size,(ptls_handshake_properties_t *)(cbuf_small + 0x3ff8)
                          );
    msg("server handshake special exit 2");
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2cf);
    iVar2 = ptls_handshake_is_complete((ptls_t *)client_hs_prop.collected_extensions);
    _ok(iVar2,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2d0);
    cbuf.capacity = 0;
  }
  if ((mode != 4) || (require_client_authentication == 1)) {
    sVar6 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar2 = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"GET / HTTP/1.0\r\n\r\n",sVar6);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2d6);
    max_early_data_size = cbuf.capacity;
    iVar2 = ptls_receive((ptls_t *)client_hs_prop.collected_extensions,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2da);
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2db);
    sVar1 = decbuf.capacity;
    sVar6 = strlen("GET / HTTP/1.0\r\n\r\n");
    _ok((uint)(sVar1 == sVar6),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2dc);
    sVar1 = consumed;
    sVar6 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar2 = memcmp((void *)sVar1,"GET / HTTP/1.0\r\n\r\n",sVar6);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2dd);
    iVar2 = ptls_handshake_is_complete((ptls_t *)client_hs_prop.collected_extensions);
    _ok(iVar2,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2de);
    decbuf.capacity = 0;
    cbuf.capacity = 0;
    sVar6 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
    iVar2 = ptls_send((ptls_t *)client_hs_prop.collected_extensions,
                      (ptls_buffer_t *)&decbuf.is_allocated,"HTTP/1.0 200 OK\r\n\r\nhello world\n",
                      sVar6);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e3);
  }
  max_early_data_size = sbuf.capacity;
  iVar2 = ptls_receive(tls,(ptls_buffer_t *)&consumed,(void *)decbuf._24_8_,&max_early_data_size);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e8);
  _ok((uint)(max_early_data_size == sbuf.capacity),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e9);
  sVar1 = decbuf.capacity;
  sVar6 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
  _ok((uint)(sVar1 == sVar6),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ea);
  sVar1 = consumed;
  sVar6 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
  iVar2 = memcmp((void *)sVar1,"HTTP/1.0 200 OK\r\n\r\nhello world\n",sVar6);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2eb);
  iVar2 = ptls_handshake_is_complete(tls);
  _ok(iVar2,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ec);
  decbuf.capacity = 0;
  sbuf.capacity = 0;
  if (mode == 4) {
    max_early_data_size = cbuf.capacity;
    iVar2 = ptls_receive((ptls_t *)client_hs_prop.collected_extensions,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f3);
    _ok((uint)(cbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f4);
    _ok((uint)(decbuf.capacity == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f5);
    iVar2 = ptls_handshake_is_complete(tls);
    _ok(iVar2,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f6);
    cbuf.capacity = 0;
  }
  if (mode == 5) {
    iVar2 = ptls_update_key((ptls_t *)client_hs_prop.collected_extensions,1);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2fd);
    _ok((uint)((byte)client_hs_prop.collected_extensions[0x160] >> 3 & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2fe);
    _ok((uint)((byte)client_hs_prop.collected_extensions[0x160] >> 4 & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ff);
    iVar2 = ptls_send((ptls_t *)client_hs_prop.collected_extensions,
                      (ptls_buffer_t *)&decbuf.is_allocated,"good bye",8);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x301);
    _ok((uint)((((byte)client_hs_prop.collected_extensions[0x160] >> 3 & 1) != 0 ^ 0xffU) & 1),
        "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
        0x302);
    _ok((uint)((((byte)client_hs_prop.collected_extensions[0x160] >> 4 & 1) != 0 ^ 0xffU) & 1),
        "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
        0x303);
    max_early_data_size = sbuf.capacity;
    iVar2 = ptls_receive(tls,(ptls_buffer_t *)&consumed,(void *)decbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x306);
    _ok((uint)(sbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x307);
    _ok((uint)(decbuf.capacity == 8),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x308);
    _ok((uint)(*(long *)consumed == 0x65796220646f6f67),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x309);
    _ok((uint)((byte)tls->field_0x160 >> 3 & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30a);
    _ok((uint)((((byte)tls->field_0x160 >> 4 & 1) != 0 ^ 0xffU) & 1),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30b);
    sbuf.capacity = 0;
    decbuf.capacity = 0;
    iVar2 = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"hello",5);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30f);
    max_early_data_size = cbuf.capacity;
    iVar2 = ptls_receive((ptls_t *)client_hs_prop.collected_extensions,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x312);
    _ok((uint)(cbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x313);
    _ok((uint)(decbuf.capacity == 5),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x314);
    iVar2 = memcmp((void *)consumed,"hello",5);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x315);
    cbuf.capacity = 0;
    decbuf.capacity = 0;
  }
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&decbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&consumed);
  ptls_free(tls);
  ptls_free((ptls_t *)client_hs_prop.collected_extensions);
  if (check_ch != 0) {
    ctx_peer->on_client_hello = (ptls_on_client_hello_t *)0x0;
  }
  ctx->verify_certificate = (ptls_verify_certificate_t *)0x0;
  if (require_client_authentication != 0) {
    ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xf7;
  }
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int mode, int expect_ticket, int check_ch, int require_client_authentication)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, ticket}}}, server_hs_prop = {{{{NULL}}}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    if (check_ch)
        ctx->verify_certificate = verify_certificate;

    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (check_ch) {
        static ptls_on_client_hello_t cb = {save_client_hello};
        ctx_peer->on_client_hello = &cb;
        static const ptls_iovec_t protocols[] = {{(uint8_t *)"h2", 2}, {(uint8_t *)"http/1.1", 8}};
        client_hs_prop.client.negotiated_protocols.list = protocols;
        client_hs_prop.client.negotiated_protocols.count = sizeof(protocols) / sizeof(protocols[0]);
        ptls_set_server_name(client, "test.example.com", 0);
    }

    static ptls_on_extension_t cb = {on_extension_cb};
    ctx_peer->on_extension = &cb;

    if (require_client_authentication) {
        ctx_peer->require_client_authentication = 1;
    }

    if (ctx_peer->esni != NULL) {
        was_esni = 0;
        client_hs_prop.client.esni_keys = ptls_iovec_init(ESNIKEYS, sizeof(ESNIKEYS) - 1);
    }

    switch (mode) {
    case TEST_HANDSHAKE_HRR:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        break;
    case TEST_HANDSHAKE_HRR_STATELESS:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
        server_hs_prop.server.retry_uses_cookie = 1;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
        break;
    }

    msg("client handshake enter 1");
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    msg("client handshake exit 1");
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    switch (mode) {
    case TEST_HANDSHAKE_2RTT:
    case TEST_HANDSHAKE_HRR:
    case TEST_HANDSHAKE_HRR_STATELESS:
        consumed = cbuf.off;
        msg("server handshake special enter 1");
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake special exit 1");
        if (mode == TEST_HANDSHAKE_HRR_STATELESS) {
            ok(ret == PTLS_ERROR_STATELESS_RETRY);
            ptls_free(server);
            server = ptls_new(ctx_peer, 1);
        } else {
            ok(ret == PTLS_ERROR_IN_PROGRESS);
        }
        ok(cbuf.off == consumed);
        ok(sbuf.off != 0);
        cbuf.off = 0;
        consumed = sbuf.off;
        msg("client handshake special enter 1");
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_hs_prop);
        msg("client handshake special exit 1");
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(sbuf.off == consumed);
        ok(cbuf.off != 0);
        sbuf.off = 0;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
        break;
    }

    consumed = cbuf.off;
    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 1)
        ok(consumed == cbuf.off);
    do
    {
        msg("server handshake enter 1, consumed: %d", consumed);
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake exit 1, consumed: %d, ret: %d, in_pk: %d", consumed, ret, ptls_handshake_in_private_key(server));
    } while ((ret == PTLS_ERROR_IN_PROGRESS) && (ptls_handshake_in_private_key(server)));
    if (require_client_authentication == 1) {
        ok(ptls_is_psk_handshake(server) == 0);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    } else {
        ok(ret == 0);
    }

    ok(sbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(server) != NULL);
        ok(strcmp(ptls_get_server_name(server), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(server) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(server), "h2") == 0);
        ok(was_esni == (ctx_peer->esni != NULL));
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 0) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(!ptls_handshake_is_complete(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 1)
            ok(consumed == cbuf.off);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    msg("client handshake enter 2");
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    msg("client handshake exit 2, ret = %d", ret);
    ok(ret == 0);
    ok(cbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(client) != NULL);
        ok(strcmp(ptls_get_server_name(client), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(client) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(client), "h2") == 0);
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (expect_ticket) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;
    }

    if (require_client_authentication == 1) {
        ok(!ptls_handshake_is_complete(server));
        consumed = cbuf.off;
        msg("server handshake special enter 2");
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake special exit 2");
        ok(ret == 0);
        ok(ptls_handshake_is_complete(server));
        cbuf.off = 0;
    }

    if (mode != TEST_HANDSHAKE_EARLY_DATA || require_client_authentication == 1) {
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(ptls_handshake_is_complete(server));
        decbuf.off = 0;
        cbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(ptls_handshake_is_complete(client));
    decbuf.off = 0;
    sbuf.off = 0;

    if (mode == TEST_HANDSHAKE_EARLY_DATA) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(ptls_handshake_is_complete(client));
        cbuf.off = 0;
    }

    if (mode == TEST_HANDSHAKE_KEY_UPDATE) {
        /* server -> client with update_request */
        ret = ptls_update_key(server, 1);
        ok(ret == 0);
        ok(server->needs_key_update);
        ok(server->key_update_send_request);
        ret = ptls_send(server, &sbuf, "good bye", 8);
        ok(ret == 0);
        ok(!server->needs_key_update);
        ok(!server->key_update_send_request);
        consumed = sbuf.off;
        ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
        ok(ret == 0);
        ok(sbuf.off == consumed);
        ok(decbuf.off == 8);
        ok(memcmp(decbuf.base, "good bye", 8) == 0);
        ok(client->needs_key_update);
        ok(!client->key_update_send_request);
        sbuf.off = 0;
        decbuf.off = 0;
        ret = ptls_send(client, &cbuf, "hello", 5);
        ok(ret == 0);
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        cbuf.off = 0;
        decbuf.off = 0;
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);

    if (check_ch)
        ctx_peer->on_client_hello = NULL;

    ctx->verify_certificate = NULL;
    if (require_client_authentication)
        ctx_peer->require_client_authentication = 0;
}